

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lydjson_get_snode(lyd_json_ctx *lydctx,ly_bool is_attr,char *prefix,size_t prefix_len,
                        char *name,size_t name_len,lyd_node *parent,lysc_node **snode,
                        lysc_ext_instance **ext)

{
  uint32_t options;
  LY_ERR LVar1;
  lysc_node *plVar2;
  lysc_node *local_a8;
  char *local_88;
  ly_ctx *local_68;
  ly_ctx *local_60;
  lys_module *plStack_50;
  uint32_t getnext_opts;
  lys_module *mod;
  LY_ERR r;
  LY_ERR ret;
  size_t name_len_local;
  char *name_local;
  size_t prefix_len_local;
  char *prefix_local;
  ly_bool is_attr_local;
  lyd_json_ctx *lydctx_local;
  
  mod._4_4_ = LY_SUCCESS;
  plStack_50 = (lys_module *)0x0;
  options = 0;
  if ((lydctx->int_opts & 4) != 0) {
    options = 0x10;
  }
  *snode = (lysc_node *)0x0;
  *ext = (lysc_ext_instance *)0x0;
  if (prefix_len == 0) {
    if (parent == (lyd_node *)0x0) {
      if ((lydctx->int_opts & 0x10) == 0) {
        local_88 = name;
        if (is_attr != '\0') {
          name_len = name_len + 1;
          local_88 = name + -1;
        }
        ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_SYNTAX_JSON,
                "Top-level JSON object member \"%.*s\" must be namespace-qualified.",
                name_len & 0xffffffff,local_88);
        return LY_EVALID;
      }
    }
    else if (parent->schema != (lysc_node *)0x0) {
      plStack_50 = parent->schema->module;
    }
  }
  else {
    if (parent == (lyd_node *)0x0) {
      local_68 = lydctx->jsonctx->ctx;
    }
    else {
      if (parent->schema == (lysc_node *)0x0) {
        local_60 = (ly_ctx *)parent[2].schema;
      }
      else {
        local_60 = parent->schema->module->ctx;
      }
      local_68 = local_60;
    }
    plStack_50 = ly_ctx_get_module_implemented2(local_68,prefix,prefix_len);
  }
  if (plStack_50 == (lys_module *)0x0) {
    LVar1 = ly_nested_ext_schema
                      (parent,(lysc_node *)0x0,prefix,prefix_len,LY_VALUE_JSON,(void *)0x0,name,
                       name_len,snode,ext);
    if (LVar1 != LY_ENOT) {
      return LVar1;
    }
    if ((lydctx->parse_opts & 0x20000) != 0) {
      ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "No module named \"%.*s\" in the context.",prefix_len & 0xffffffff,prefix);
      return LY_EVALID;
    }
  }
  LVar1 = mod._4_4_;
  if ((plStack_50 != (lys_module *)0x0) &&
     ((parent == (lyd_node *)0x0 || (parent->schema != (lysc_node *)0x0)))) {
    if ((parent == (lyd_node *)0x0) && (lydctx->ext != (lysc_ext_instance *)0x0)) {
      plVar2 = lysc_ext_find_node(lydctx->ext,plStack_50,name,name_len,0,options);
      *snode = plVar2;
    }
    else {
      plVar2 = lyd_parser_node_schema(parent);
      plVar2 = lys_find_child(plVar2,plStack_50,name,name_len,0,options);
      *snode = plVar2;
    }
    if (*snode == (lysc_node *)0x0) {
      LVar1 = ly_nested_ext_schema
                        (parent,(lysc_node *)0x0,prefix,prefix_len,LY_VALUE_JSON,(void *)0x0,name,
                         name_len,snode,ext);
      if ((LVar1 == LY_ENOT) && (LVar1 = mod._4_4_, (lydctx->parse_opts & 0x20000) != 0)) {
        if (parent == (lyd_node *)0x0) {
          if (lydctx->ext == (lysc_ext_instance *)0x0) {
            ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Node \"%.*s\" not found in the \"%s\" module.",name_len & 0xffffffff,name,
                    plStack_50->name);
          }
          else if (lydctx->ext->argument == (char *)0x0) {
            ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Node \"%.*s\" not found in the %s extension instance.",name_len & 0xffffffff,
                    name,lydctx->ext->def->name);
          }
          else {
            ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Node \"%.*s\" not found in the \"%s\" %s extension instance.",
                    name_len & 0xffffffff,name,lydctx->ext->argument,lydctx->ext->def->name);
          }
        }
        else {
          if (parent->schema == (lysc_node *)0x0) {
            local_a8 = parent[1].schema;
          }
          else {
            local_a8 = (lysc_node *)parent->schema->name;
          }
          ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
                  "Node \"%.*s\" not found as a child of \"%s\" node.",name_len & 0xffffffff,name,
                  local_a8);
        }
        mod._4_4_ = LY_EVALID;
        LVar1 = mod._4_4_;
      }
    }
    else {
      LVar1 = lyd_parser_check_schema((lyd_ctx *)lydctx,*snode);
    }
  }
  mod._4_4_ = LVar1;
  return mod._4_4_;
}

Assistant:

static LY_ERR
lydjson_get_snode(struct lyd_json_ctx *lydctx, ly_bool is_attr, const char *prefix, size_t prefix_len, const char *name,
        size_t name_len, struct lyd_node *parent, const struct lysc_node **snode, struct lysc_ext_instance **ext)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lys_module *mod = NULL;
    uint32_t getnext_opts = lydctx->int_opts & LYD_INTOPT_REPLY ? LYS_GETNEXT_OUTPUT : 0;

    *snode = NULL;
    *ext = NULL;

    /* get the element module, prefer parent context because of extensions */
    if (prefix_len) {
        mod = ly_ctx_get_module_implemented2(parent ? LYD_CTX(parent) : lydctx->jsonctx->ctx, prefix, prefix_len);
    } else if (parent) {
        if (parent->schema) {
            mod = parent->schema->module;
        }
    } else if (!(lydctx->int_opts & LYD_INTOPT_ANY)) {
        LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "Top-level JSON object member \"%.*s\" must be namespace-qualified.",
                (int)(is_attr ? name_len + 1 : name_len), is_attr ? name - 1 : name);
        ret = LY_EVALID;
        goto cleanup;
    }
    if (!mod) {
        /* check for extension data */
        r = ly_nested_ext_schema(parent, NULL, prefix, prefix_len, LY_VALUE_JSON, NULL, name, name_len, snode, ext);
        if (r != LY_ENOT) {
            /* success or error */
            ret = r;
            goto cleanup;
        }

        /* unknown module */
        if (lydctx->parse_opts & LYD_PARSE_STRICT) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "No module named \"%.*s\" in the context.", (int)prefix_len, prefix);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    /* get the schema node */
    if (mod && (!parent || parent->schema)) {
        if (!parent && lydctx->ext) {
            *snode = lysc_ext_find_node(lydctx->ext, mod, name, name_len, 0, getnext_opts);
        } else {
            *snode = lys_find_child(lyd_parser_node_schema(parent), mod, name, name_len, 0, getnext_opts);
        }
        if (!*snode) {
            /* check for extension data */
            r = ly_nested_ext_schema(parent, NULL, prefix, prefix_len, LY_VALUE_JSON, NULL, name, name_len, snode, ext);
            if (r != LY_ENOT) {
                /* success or error */
                ret = r;
                goto cleanup;
            }

            /* unknown data node */
            if (lydctx->parse_opts & LYD_PARSE_STRICT) {
                if (parent) {
                    LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Node \"%.*s\" not found as a child of \"%s\" node.",
                            (int)name_len, name, LYD_NAME(parent));
                } else if (lydctx->ext) {
                    if (lydctx->ext->argument) {
                        LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE,
                                "Node \"%.*s\" not found in the \"%s\" %s extension instance.",
                                (int)name_len, name, lydctx->ext->argument, lydctx->ext->def->name);
                    } else {
                        LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Node \"%.*s\" not found in the %s extension instance.",
                                (int)name_len, name, lydctx->ext->def->name);
                    }
                } else {
                    LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Node \"%.*s\" not found in the \"%s\" module.",
                            (int)name_len, name, mod->name);
                }
                ret = LY_EVALID;
                goto cleanup;
            }
        } else {
            /* check that schema node is valid and can be used */
            ret = lyd_parser_check_schema((struct lyd_ctx *)lydctx, *snode);
        }
    }

cleanup:
    return ret;
}